

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O0

Apply * __thiscall
jsonnet::internal::Desugarer::stdFunc
          (Desugarer *this,LocationRange *loc,UString *name,AST *a,AST *b)

{
  initializer_list<jsonnet::internal::ArgParam> __l;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RSI;
  void **in_RDI;
  UString *in_stack_fffffffffffffe28;
  Desugarer *in_stack_fffffffffffffe30;
  undefined1 *puVar1;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *args_4;
  AST *expr;
  undefined1 *this_00;
  allocator_type *in_stack_fffffffffffffe48;
  LocationRange *in_stack_fffffffffffffe50;
  iterator in_stack_fffffffffffffe58;
  LocationRange *in_stack_fffffffffffffe60;
  Desugarer *in_stack_fffffffffffffe68;
  Desugarer *in_stack_fffffffffffffe70;
  undefined8 **ppuVar2;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffe78;
  undefined8 **ppuVar3;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffe80;
  bool *in_stack_fffffffffffffe88;
  LiteralString **in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb1;
  undefined1 in_stack_fffffffffffffeb2;
  undefined5 in_stack_fffffffffffffeb3;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffeb8;
  undefined1 *local_138 [22];
  undefined8 *local_88;
  undefined8 local_80;
  _func_int **local_60;
  _Alloc_hider local_58;
  undefined7 uStack_57;
  LiteralString *local_50;
  undefined1 local_41;
  undefined8 local_40;
  Index *local_38;
  Apply *local_8;
  
  local_40 = std(in_stack_fffffffffffffe70);
  local_41 = '\0';
  local_50 = str(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  local_58 = (_Alloc_hider)0x0;
  uStack_57 = 0;
  local_60 = (_func_int **)0x0;
  this_00 = EF;
  expr = (AST *)&stack0xffffffffffffffa0;
  puVar1 = EF;
  local_38 = make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::LiteralString*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                       (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                        &in_stack_fffffffffffffe58->idFodder,(Var **)in_stack_fffffffffffffe50,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)in_stack_fffffffffffffe48,(bool *)EF,in_stack_fffffffffffffe90,in_RSI,
                        in_RDI,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,
                        (void **)CONCAT53(in_stack_fffffffffffffeb3,
                                          CONCAT12(in_stack_fffffffffffffeb2,
                                                   CONCAT11(in_stack_fffffffffffffeb1,
                                                            in_stack_fffffffffffffeb0))),
                        in_stack_fffffffffffffeb8);
  ArgParam::ArgParam((ArgParam *)this_00,expr,(Fodder *)puVar1);
  ArgParam::ArgParam((ArgParam *)this_00,expr,(Fodder *)puVar1);
  local_88 = local_138;
  local_80 = 2;
  ::std::allocator<jsonnet::internal::ArgParam>::allocator
            ((allocator<jsonnet::internal::ArgParam> *)0x2af984);
  __l._M_len = (size_type)in_stack_fffffffffffffe60;
  __l._M_array = in_stack_fffffffffffffe58;
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             in_stack_fffffffffffffe50,__l,in_stack_fffffffffffffe48);
  args_4 = (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
           &stack0xfffffffffffffeb1;
  puVar1 = EF;
  local_8 = make<jsonnet::internal::Apply,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Index*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                      ((Desugarer *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                       (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        *)in_stack_fffffffffffffe48,(Index **)this_00,
                       (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        *)expr,args_4,(bool *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
                       in_stack_fffffffffffffe80,in_stack_fffffffffffffe88);
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::~vector
            (args_4);
  ::std::allocator<jsonnet::internal::ArgParam>::~allocator
            ((allocator<jsonnet::internal::ArgParam> *)0x2afa37);
  ppuVar3 = (undefined8 **)local_138;
  ppuVar2 = &local_88;
  do {
    ppuVar2 = ppuVar2 + -0xb;
    ArgParam::~ArgParam((ArgParam *)puVar1);
  } while (ppuVar2 != ppuVar3);
  return local_8;
}

Assistant:

Apply *stdFunc(const LocationRange &loc, const UString &name, AST *a, AST *b)
    {
        return make<Apply>(
            loc,
            EF,
            make<Index>(E, EF, std(), EF, false, str(name), EF, nullptr, EF, nullptr, EF),
            EF,
            ArgParams{{a, EF}, {b, EF}},
            false,  // trailingComma
            EF,
            EF,
            true  // tailstrict
        );
    }